

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example8.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  Scene *this;
  Sphere *this_00;
  Texture *m;
  LightSource *l;
  LightSource *l_00;
  Vector local_88;
  Vector local_68;
  Vector local_48;
  
  this = (Scene *)operator_new(0xe8);
  Scene::Scene(this);
  this_00 = (Sphere *)operator_new(200);
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = 0.0;
  Sphere::Sphere(this_00,&local_88,4.0);
  (this_00->super_GeometricObject).def_material.ka = 0.3;
  (this_00->super_GeometricObject).def_material.kd = 0.2;
  (this_00->super_GeometricObject).def_material.ks = 0.7;
  (this_00->super_GeometricObject).def_material.kr = 0.0;
  (this_00->super_GeometricObject).def_material.p = 0x1e;
  dVar1 = Grayzer::Medium::glass.beta;
  (this_00->super_GeometricObject).def_material.med.ior = Grayzer::Medium::glass.ior;
  (this_00->super_GeometricObject).def_material.med.beta = dVar1;
  (this_00->super_GeometricObject).def_material.color.x = 1.0;
  (this_00->super_GeometricObject).def_material.color.y = 0.0;
  (this_00->super_GeometricObject).def_material.color.z = 0.0;
  m = (Texture *)operator_new(0x60);
  m->next = (Texture *)0x0;
  m->object = (GeometricObject *)0x0;
  m->turb = 0.0;
  m->octaves = 6;
  (m->offs).z = 0.0;
  (m->offs).x = 0.0;
  (m->offs).y = 0.0;
  (m->scale).x = 1.0;
  (m->scale).y = 1.0;
  m->_vptr_Texture = (_func_int **)&PTR__Texture_0010ac60;
  (m->scale).z = 1.0;
  m[1]._vptr_Texture = (_func_int **)0x401c000000000000;
  GeometricObject::add((GeometricObject *)this_00,m);
  l = (LightSource *)operator_new(0x40);
  (l->color).x = 1.0;
  (l->color).y = 1.0;
  l->_vptr_LightSource = (_func_int **)&PTR__LightSource_0010ac10;
  (l->color).z = 1.0;
  l[1]._vptr_LightSource = (_func_int **)0xc024000000000000;
  l[1].color.x = 8.0;
  l[1].color.y = -20.0;
  l[1].color.z = 20.0;
  l_00 = (LightSource *)operator_new(0x40);
  (l_00->color).x = 1.0;
  (l_00->color).y = 1.0;
  l_00->_vptr_LightSource = (_func_int **)&PTR__LightSource_0010ac10;
  (l_00->color).z = 1.0;
  l_00[1]._vptr_LightSource = (_func_int **)0x4024000000000000;
  l_00[1].color.x = 8.0;
  l_00[1].color.y = -20.0;
  l_00[1].color.z = 20.0;
  Scene::add(this,(GeometricObject *)this_00);
  Scene::add(this,l);
  Scene::add(this,l_00);
  (this->background).x = 0.196078;
  (this->background).y = 0.6;
  (this->background).z = 0.8;
  init_noise();
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = -7.0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  local_68.x._0_4_ = 0;
  local_68.x._4_4_ = 0;
  local_68.y._0_4_ = 0;
  local_68.y._4_4_ = 0x3ff00000;
  local_68.z = 0.0;
  Scene::setCamera(this,&local_88,&local_48,&local_68);
  render_scene(this,1.5,1.0,300,200,"SAMPLE80.TGA");
  done_noise();
  return 0;
}

Assistant:

int main()
{
    Sphere* Sphere1;
    LightSource *Light1,*Light2;

    Scene* scene = new Scene;
    Sphere1 = new Sphere(Vector(0,0,0),4);

    Sphere1->ambient(0.3);
    Sphere1->diffuse(0.2);
    Sphere1->specular(0.7);
    Sphere1->reflection(0.0);
    Sphere1->ior(0.0);
    Sphere1->phong_size(30);
    Sphere1->medium(Grayzer::Medium::glass);
    Sphere1->color(Red);
    Sphere1->add(new Bumps(7.0));

    Light1 = new PointLight(Vector(-10,8,-20),20);
    Light2 = new PointLight(Vector(10,8,-20),20);

    scene->add(Sphere1);
    scene->add(Light1);
    scene->add(Light2);

    scene->setBackground(SkyBlue);

    init_noise();
    scene->setCamera(Vector(0,0,-7),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE80.TGA");
    done_noise();
}